

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void __thiscall Rml::DataParser::Error(DataParser *this,String *message)

{
  size_t sVar1;
  undefined8 uVar2;
  size_type __n;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  String cursor_string;
  size_t cursor_offset;
  String *message_local;
  DataParser *this_local;
  
  this->parse_error = true;
  sVar1 = this->index;
  uVar2 = ::std::__cxx11::string::c_str();
  Log::Message(LT_WARNING,"Error in data expression at %zu. %s",sVar1,uVar2);
  uVar2 = ::std::__cxx11::string::c_str();
  Log::Message(LT_WARNING,"  \"%s\"",uVar2);
  __n = this->index + 3;
  cursor_string.field_2._8_8_ = __n;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__n,' ',&local_61);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,'^');
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::allocator<char>::~allocator(&local_61);
  uVar2 = ::std::__cxx11::string::c_str();
  Log::Message(LT_WARNING,"%s",uVar2);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Error(const String& message)
	{
		parse_error = true;
		Log::Message(Log::LT_WARNING, "Error in data expression at %zu. %s", index, message.c_str());
		Log::Message(Log::LT_WARNING, "  \"%s\"", expression.c_str());

		const size_t cursor_offset = size_t(index) + 3;
		const String cursor_string = String(cursor_offset, ' ') + '^';
		Log::Message(Log::LT_WARNING, "%s", cursor_string.c_str());
	}